

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O2

Program * __thiscall
deqp::gles31::Functional::ProgramInterfaceQueryTestCase::getAndCheckProgramDefinition
          (ProgramInterfaceQueryTestCase *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ContextType ctxType;
  undefined4 extraout_var;
  NotSupportedError *pNVar4;
  allocator<char> local_39;
  string local_38;
  Program *this_00;
  
  iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
  this_00 = (Program *)CONCAT44(extraout_var,iVar3);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  bVar2 = ProgramInterfaceDefinition::Program::hasStage(this_00,SHADERTYPE_TESSELLATION_CONTROL);
  if (bVar2) {
    if (bVar1) goto LAB_013008ca;
LAB_01300882:
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_EXT_tessellation_shader");
    if (!bVar2) {
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Test requires GL_EXT_tessellation_shader extension",&local_39)
      ;
      tcu::NotSupportedError::NotSupportedError(pNVar4,&local_38);
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  else {
    bVar2 = ProgramInterfaceDefinition::Program::hasStage
                      (this_00,SHADERTYPE_TESSELLATION_EVALUATION);
    if (bVar2 && !bVar1) goto LAB_01300882;
  }
  if (((this->m_queryTarget).propFlags == 0x20000 && !bVar1) &&
     (bVar2 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_EXT_tessellation_shader"), !bVar2)) {
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Test requires GL_EXT_tessellation_shader extension",&local_39);
    tcu::NotSupportedError::NotSupportedError(pNVar4,&local_38);
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
LAB_013008ca:
  bVar2 = ProgramInterfaceDefinition::Program::hasStage(this_00,SHADERTYPE_GEOMETRY);
  if ((bVar2 && !bVar1) &&
     (bVar2 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_geometry_shader")
     , !bVar2)) {
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Test requires GL_EXT_geometry_shader extension",&local_39);
    tcu::NotSupportedError::NotSupportedError(pNVar4,&local_38);
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  bVar2 = programContainsIOBlocks(this_00);
  if ((!bVar1 && bVar2) &&
     (bVar1 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_shader_io_blocks"
                        ), !bVar1)) {
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Test requires GL_EXT_shader_io_blocks extension",&local_39);
    tcu::NotSupportedError::NotSupportedError(pNVar4,&local_38);
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  return this_00;
}

Assistant:

const ProgramInterfaceDefinition::Program* ProgramInterfaceQueryTestCase::getAndCheckProgramDefinition (void)
{
	const ProgramInterfaceDefinition::Program* programDefinition = getProgramDefinition();
	DE_ASSERT(programDefinition->isValid());

	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (programDefinition->hasStage(glu::SHADERTYPE_TESSELLATION_CONTROL) ||
		programDefinition->hasStage(glu::SHADERTYPE_TESSELLATION_EVALUATION))
	{
		if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
			throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader extension");
	}

	// Testing IS_PER_PATCH as a part of a larger set is ok, since the extension is checked
	// before query. However, we don't want IS_PER_PATCH-specific tests to become noop and pass.
	if (m_queryTarget.propFlags == PROGRAMRESOURCEPROP_IS_PER_PATCH)
	{
		if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
			throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader extension");
	}

	if (programDefinition->hasStage(glu::SHADERTYPE_GEOMETRY))
	{
		if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
			throw tcu::NotSupportedError("Test requires GL_EXT_geometry_shader extension");
	}

	if (programContainsIOBlocks(programDefinition))
	{
		if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_shader_io_blocks"))
			throw tcu::NotSupportedError("Test requires GL_EXT_shader_io_blocks extension");
	}

	return programDefinition;
}